

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void codeApplyAffinity(Parse *pParse,int base,int n,char *zAff)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int p2;
  
  if (zAff == (char *)0x0) {
    return;
  }
  uVar2 = n >> 0x1f & n;
  for (; (uVar3 = uVar2, 0 < n && (uVar3 = n, *zAff == 'A')); zAff = zAff + 1) {
    n = n - 1;
    base = base + 1;
  }
  uVar4 = (ulong)uVar3;
  do {
    p2 = (int)uVar4;
    if (p2 < 2) {
      if (uVar4 != 1) {
        return;
      }
      break;
    }
    lVar1 = uVar4 - 1;
    uVar4 = uVar4 - 1;
  } while (zAff[lVar1] == 'A');
  sqlite3VdbeAddOp4(pParse->pVdbe,0x62,base,p2,0,zAff,p2);
  sqlite3ExprCacheRemove(pParse,base,p2);
  return;
}

Assistant:

static void codeApplyAffinity(Parse *pParse, int base, int n, char *zAff){
  Vdbe *v = pParse->pVdbe;
  if( zAff==0 ){
    assert( pParse->db->mallocFailed );
    return;
  }
  assert( v!=0 );

  /* Adjust base and n to skip over SQLITE_AFF_BLOB entries at the beginning
  ** and end of the affinity string.
  */
  while( n>0 && zAff[0]==SQLITE_AFF_BLOB ){
    n--;
    base++;
    zAff++;
  }
  while( n>1 && zAff[n-1]==SQLITE_AFF_BLOB ){
    n--;
  }

  /* Code the OP_Affinity opcode if there is anything left to do. */
  if( n>0 ){
    sqlite3VdbeAddOp4(v, OP_Affinity, base, n, 0, zAff, n);
    sqlite3ExprCacheAffinityChange(pParse, base, n);
  }
}